

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O2

SQTable * __thiscall SQTable::Clone(SQTable *this)

{
  SQTable *this_00;
  SQObjectValue SVar1;
  SQObjectPtr local_60;
  SQObjectPtr val;
  SQObjectPtr key;
  
  this_00 = Create((this->super_SQDelegable).super_SQCollectable._sharedstate,this->_numofnodes);
  key.super_SQObject._type = OT_NULL;
  key.super_SQObject._unVal.pTable = (SQTable *)0x0;
  val.super_SQObject._type = OT_NULL;
  val.super_SQObject._unVal.pTable = (SQTable *)0x0;
  SVar1.pTable = (SQTable *)0x0;
  while( true ) {
    local_60.super_SQObject._type = OT_INTEGER;
    local_60.super_SQObject._unVal = SVar1;
    SVar1.nInteger = Next(this,true,&local_60,&key,&val);
    SQObjectPtr::~SQObjectPtr(&local_60);
    if (SVar1.pTable == (SQTable *)0xffffffffffffffff) break;
    NewSlot(this_00,&key,&val);
  }
  SQDelegable::SetDelegate(&this_00->super_SQDelegable,(this->super_SQDelegable)._delegate);
  SQObjectPtr::~SQObjectPtr(&val);
  SQObjectPtr::~SQObjectPtr(&key);
  return this_00;
}

Assistant:

SQTable *SQTable::Clone()
{
    SQTable *nt=Create(_opt_ss(this),_numofnodes);
#ifdef _FAST_CLONE
    _HashNode *basesrc = _nodes;
    _HashNode *basedst = nt->_nodes;
    _HashNode *src = _nodes;
    _HashNode *dst = nt->_nodes;
    SQInteger n = 0;
    for(n = 0; n < _numofnodes; n++) {
        dst->key = src->key;
        dst->val = src->val;
        if(src->next) {
            assert(src->next > basesrc);
            dst->next = basedst + (src->next - basesrc);
            assert(dst != dst->next);
        }
        dst++;
        src++;
    }
    assert(_firstfree > basesrc);
    assert(_firstfree != NULL);
    nt->_firstfree = basedst + (_firstfree - basesrc);
    nt->_usednodes = _usednodes;
#else
    SQInteger ridx=0;
    SQObjectPtr key,val;
    while((ridx=Next(true,ridx,key,val))!=-1){
        nt->NewSlot(key,val);
    }
#endif
    nt->SetDelegate(_delegate);
    return nt;
}